

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_bool>
* __thiscall
google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::
insert<google::protobuf::MapKey_const&>
          (pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_bool>
           *__return_storage_ptr__,void *this,MapKey *k)

{
  unsigned_long b;
  bool bVar1;
  Node *node;
  pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_unsigned_long>
  p;
  pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_unsigned_long>
  local_68;
  pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_unsigned_long>
  local_48;
  
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  FindHelper<google::protobuf::MapKey>(&local_68,(InnerMap *)this,k,(TreeIterator *)0x0);
  if (local_68.first.node_ == (Node *)0x0) {
    bVar1 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
            ResizeIfLoadIsOutOfRange((InnerMap *)this,*this + 1);
    if (bVar1) {
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      FindHelper<google::protobuf::MapKey>(&local_48,(InnerMap *)this,k,(TreeIterator *)0x0);
      local_68.first.bucket_index_ = local_48.first.bucket_index_;
      local_68.first.node_ = local_48.first.node_;
      local_68.first.m_ = local_48.first.m_;
      local_68.second = local_48.second;
    }
    b = local_68.second;
    if (*(Arena **)((long)this + 0x28) == (Arena *)0x0) {
      node = (Node *)operator_new(0x40);
    }
    else {
      node = (Node *)Arena::AllocateAlignedWithHook
                               (*(Arena **)((long)this + 0x28),0x40,
                                (type_info *)&unsigned_char::typeinfo);
    }
    Arena::CreateInArenaStorage<google::protobuf::MapKey,google::protobuf::MapKey_const&>
              ((MapKey *)node,*(Arena **)((long)this + 0x28),k);
    *(undefined8 *)&node->field_0x28 = 0;
    *(undefined4 *)&node->field_0x30 = 0;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::InsertUnique
              (&__return_storage_ptr__->first,(InnerMap *)this,b,node);
    *(long *)this = *this + 1;
    bVar1 = true;
  }
  else {
    (__return_storage_ptr__->first).node_ = local_68.first.node_;
    (__return_storage_ptr__->first).m_ = local_68.first.m_;
    (__return_storage_ptr__->first).bucket_index_ = local_68.first.bucket_index_;
    bVar1 = false;
  }
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(K&& k) {
      std::pair<const_iterator, size_type> p = FindHelper(k);
      // Case 1: key was already present.
      if (p.first.node_ != nullptr)
        return std::make_pair(iterator(p.first), false);
      // Case 2: insert.
      if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
        p = FindHelper(k);
      }
      const size_type b = p.second;  // bucket number
      // If K is not key_type, make the conversion to key_type explicit.
      using TypeToInit = typename std::conditional<
          std::is_same<typename std::decay<K>::type, key_type>::value, K&&,
          key_type>::type;
      Node* node = Alloc<Node>(1);
      // Even when arena is nullptr, CreateInArenaStorage is still used to
      // ensure the arena of submessage will be consistent. Otherwise,
      // submessage may have its own arena when message-owned arena is enabled.
      Arena::CreateInArenaStorage(const_cast<Key*>(&node->kv.first),
                                  alloc_.arena(),
                                  static_cast<TypeToInit>(std::forward<K>(k)));
      Arena::CreateInArenaStorage(&node->kv.second, alloc_.arena());

      iterator result = InsertUnique(b, node);
      ++num_elements_;
      return std::make_pair(result, true);
    }